

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

bool __thiscall pugi::xml_node::set_name(xml_node *this,char_t *rhs)

{
  xml_node_struct *header;
  bool bVar1;
  uint uVar2;
  size_t source_length;
  
  header = this->_root;
  if (header == (xml_node_struct *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = (uint)header->header & 0xf;
  }
  if (uVar2 != 7 && (uVar2 & 0xfffffffb) != 2) {
    return false;
  }
  source_length = strlen(rhs);
  bVar1 = impl::(anonymous_namespace)::strcpy_insitu<char*,unsigned_long>
                    (&header->name,&header->header,0x20,rhs,source_length);
  return bVar1;
}

Assistant:

PUGI_IMPL_FN bool xml_node::set_name(const char_t* rhs)
	{
		xml_node_type type_ = _root ? PUGI_IMPL_NODETYPE(_root) : node_null;

		if (type_ != node_element && type_ != node_pi && type_ != node_declaration)
			return false;

		return impl::strcpy_insitu(_root->name, _root->header, impl::xml_memory_page_name_allocated_mask, rhs, impl::strlength(rhs));
	}